

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsStore::Write<tcu::Vector<unsigned_int,4>>
          (BasicAllFormatsStore *this,GLenum internalformat,Vector<unsigned_int,_4> *write_value,
          Vector<unsigned_int,_4> *expected_value)

{
  uint uVar1;
  bool bVar2;
  GLuint program;
  uint unit;
  GLint location;
  ostream *poVar3;
  undefined8 uVar4;
  GLenum e;
  GLenum e_00;
  uvec4 *extraout_RDX;
  uvec4 *b;
  uvec4 *extraout_RDX_00;
  Vector<unsigned_int,_4> *v;
  Vector<unsigned_int,_4> *v_00;
  long lVar5;
  char *pcVar6;
  TestLog **this_00;
  CallLogWrapper *this_01;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  GLuint texture;
  undefined4 uStack_22c;
  BasicAllFormatsStore *local_210;
  string local_208;
  string local_1e8;
  Vector<unsigned_int,_4> local_1c8;
  Vector<unsigned_int,_4> local_1b8;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar3 = std::operator<<((ostream *)&os,"#version 420 core\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1e8,(void *)(ulong)internalformat,e);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  pcVar6 = ") writeonly uniform ";
  poVar3 = std::operator<<(poVar3,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>(&local_208,pcVar6);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  pcVar6 = 
  "image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, "
  ;
  poVar3 = std::operator<<(poVar3,
                           "image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>((string *)&data,pcVar6);
  poVar3 = std::operator<<(poVar3,(string *)&data);
  poVar3 = std::operator<<(poVar3,"vec4");
  poVar3 = tcu::operator<<(poVar3,write_value);
  std::operator<<(poVar3,");\n  discard;\n}");
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  program = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)this,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)CONCAT44(uStack_22c,texture),
                       (bool *)0x0);
  std::__cxx11::string::~string((string *)&texture);
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::vector
            (&data,0x100,(allocator_type *)&os);
  this_01 = (CallLogWrapper *)(this + 8);
  local_210 = this;
  glu::CallLogWrapper::glGenTextures(this_01,1,&texture);
  uVar1 = 0;
  do {
    unit = uVar1;
    if (unit == 8) {
      glu::CallLogWrapper::glDeleteTextures(this_01,1,&texture);
      glu::CallLogWrapper::glUseProgram(this_01,0);
      glu::CallLogWrapper::glDeleteProgram(this_01,program);
LAB_00a2befe:
      std::
      _Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
      ~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                   );
      return 7 < unit;
    }
    glu::CallLogWrapper::glBindTexture(this_01,0xde1,texture);
    glu::CallLogWrapper::glTexParameteri(this_01,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_01,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_01,0xde1,0,internalformat,0x10,0x10,0,0x8d99,0x1405,
               data.
               super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(this_01,0xde1,0);
    glu::CallLogWrapper::glViewport(this_01,0,0,0x10,0x10);
    glu::CallLogWrapper::glUseProgram(this_01,program);
    glu::CallLogWrapper::glBindImageTexture(this_01,unit,texture,0,'\0',0,0x88b9,internalformat);
    glu::CallLogWrapper::glBindVertexArray(this_01,*(GLuint *)(local_210 + 0x28));
    glu::CallLogWrapper::glDrawArrays(this_01,5,0,4);
    glu::CallLogWrapper::glBindTexture(this_01,0xde1,texture);
    glu::CallLogWrapper::glMemoryBarrier(this_01,0x100);
    uVar4 = 0x8d99;
    glu::CallLogWrapper::glGetTexImage
              (this_01,0xde1,0,0x8d99,0x1405,
               data.
               super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    lVar5 = 0;
    b = extraout_RDX;
    this_00 = (TestLog **)
              data.
              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (lVar5 = lVar5 + -0x10, lVar5 != -0x1010) {
      bVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                        ((ShaderImageLoadStoreBase *)this_00,expected_value,b,(GLenum)uVar4);
      b = extraout_RDX_00;
      this_00 = this_00 + 2;
      if (!bVar2) {
        glu::CallLogWrapper::glDeleteTextures(this_01,1,&texture);
        glu::CallLogWrapper::glUseProgram(this_01,0);
        glu::CallLogWrapper::glDeleteProgram(this_01,program);
        tcu::Vector<unsigned_int,_4>::Vector
                  (&local_1b8,
                   (Vector<unsigned_int,_4> *)
                   ((long)data.
                          super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (-0x10 - lVar5)));
        ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>((string *)&os,&local_1b8,v);
        tcu::Vector<unsigned_int,_4>::Vector(&local_1c8,expected_value);
        ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_1e8,&local_1c8,v_00);
        ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  (&local_208,(void *)(ulong)internalformat,e_00);
        gl4cts::anon_unknown_0::Output
                  ("Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",
                   os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                   local_1e8._M_dataplus._M_p,local_208._M_dataplus._M_p,(ulong)unit);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&os);
        goto LAB_00a2befe;
      }
    }
    uVar1 = 8;
    if (unit != 7) {
      location = glu::CallLogWrapper::glGetUniformLocation(this_01,program,"g_image");
      glu::CallLogWrapper::glUniform1i(this_01,location,unit + 1);
      uVar1 = unit + 1;
    }
  } while( true );
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint   program = BuildProgram(src_vs, NULL, NULL, NULL, GenFS(internalformat, write_value).c_str());
		const int	  kSize   = 16;
		std::vector<T> data(kSize * kSize);
		GLuint		   texture;
		glGenTextures(1, &texture);

		for (GLuint unit = 0; unit < 8; ++unit)
		{
			glBindTexture(GL_TEXTURE_2D, texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);

			glViewport(0, 0, kSize, kSize);
			glUseProgram(program);
			glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
			glBindVertexArray(m_vao);
			glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

			glBindTexture(GL_TEXTURE_2D, texture);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, Format<T>(), Type<T>(), &data[0]);

			for (int i = 0; i < kSize * kSize; ++i)
			{
				if (!Equal(data[i], expected_value, internalformat))
				{
					glDeleteTextures(1, &texture);
					glUseProgram(0);
					glDeleteProgram(program);
					Output("Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",
						   ToString(data[i]).c_str(), ToString(expected_value).c_str(),
						   FormatEnumToString(internalformat).c_str(), unit);
					return false;
				}
			}

			if (unit < 7)
			{
				glUniform1i(glGetUniformLocation(program, "g_image"), static_cast<GLint>(unit + 1));
			}
		}

		glDeleteTextures(1, &texture);
		glUseProgram(0);
		glDeleteProgram(program);

		return true;
	}